

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log_contexts.cpp
# Opt level: O2

void __thiscall duckdb::DuckDBLogContextData::~DuckDBLogContextData(DuckDBLogContextData *this)

{
  ~DuckDBLogContextData(this);
  operator_delete(this);
  return;
}

Assistant:

explicit DuckDBLogContextData(shared_ptr<LogStorage> log_storage_p) : log_storage(std::move(log_storage_p)) {
		scan_state = log_storage->CreateScanContextsState();
		log_storage->InitializeScanContexts(*scan_state);
	}